

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# launch_fixed.cpp
# Opt level: O2

void authenticate_and_launch(void)

{
  int iVar1;
  char response [8];
  
  printf("Secret: ");
  *(undefined8 *)(_ITM_registerTMCloneTable + *(long *)(std::cin + -0x18)) = 8;
  std::operator>>((basic_istream<char,_std::char_traits<char>_> *)&std::cin,&response);
  iVar1 = bcmp(&response,"Joshua",7);
  if (iVar1 == 0) {
    puts("Access granted");
    launch_missiles(2);
  }
  else {
    puts("Access denied");
  }
  return;
}

Assistant:

void authenticate_and_launch() {
  int n_missiles = 2;
  bool allowaccess = false;
  char response[8];

  printf("Secret: ");
  size_t max = sizeof response;
  std::cin >> std::setw(max) >> response;

  if (strcmp(response, "Joshua") == 0)
    allowaccess = true;

  if (allowaccess) {
    puts("Access granted");
    launch_missiles(n_missiles);
  }

  if (!allowaccess)
    puts("Access denied");
}